

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs,char *filename)

{
  bool bVar1;
  size_type __n;
  pointer pcVar2;
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_90;
  cmListFileArgument *local_88;
  undefined1 local_70 [8];
  string value;
  const_iterator i;
  string efp;
  char *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outArgs_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs_local;
  cmMakefile *this_local;
  
  GetExecutionFilePath_abi_cxx11_((string *)&i,this);
  efp.field_2._8_8_ = filename;
  if (filename == (char *)0x0) {
    efp.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  __gnu_cxx::
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  ::__normal_iterator((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                       *)((long)&value.field_2 + 8));
  std::__cxx11::string::string((string *)local_70);
  __n = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(inArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(outArgs,__n);
  local_88 = (cmListFileArgument *)
             std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(inArgs);
  value.field_2._8_8_ = local_88;
  while( true ) {
    local_90._M_current =
         (cmListFileArgument *)
         std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(inArgs);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                        *)((long)&value.field_2 + 8),&local_90);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
             ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                           *)((long)&value.field_2 + 8));
    if (pcVar2->Delim == Bracket) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outArgs,&pcVar2->Value);
    }
    else {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_70,(string *)pcVar2);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      ExpandVariablesInString
                (this,(string *)local_70,false,false,false,(char *)efp.field_2._8_8_,pcVar2->Line,
                 false,false);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                             *)((long)&value.field_2 + 8));
      if (pcVar2->Delim == Quoted) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(outArgs,(value_type *)local_70);
      }
      else {
        cmSystemTools::ExpandListArgument((string *)local_70,outArgs,false);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++((__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                  *)((long)&value.field_2 + 8));
  }
  bVar1 = cmSystemTools::GetFatalErrorOccured();
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&i);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<std::string>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename)
    {
    filename = efp.c_str();
    }
  std::vector<cmListFileArgument>::const_iterator i;
  std::string value;
  outArgs.reserve(inArgs.size());
  for(i = inArgs.begin(); i != inArgs.end(); ++i)
    {
    // No expansion in a bracket argument.
    if(i->Delim == cmListFileArgument::Bracket)
      {
      outArgs.push_back(i->Value);
      continue;
      }
    // Expand the variables in the argument.
    value = i->Value;
    this->ExpandVariablesInString(value, false, false, false,
                                  filename, i->Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if(i->Delim == cmListFileArgument::Quoted)
      {
      outArgs.push_back(value);
      }
    else
      {
      cmSystemTools::ExpandListArgument(value, outArgs);
      }
    }
  return !cmSystemTools::GetFatalErrorOccured();
}